

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cpp
# Opt level: O2

void __thiscall myvk::Surface::~Surface(Surface *this)

{
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Surface_00321ea0;
  if (this->m_surface != (VkSurfaceKHR)0x0) {
    (*vkDestroySurfaceKHR)
              (((this->m_instance_ptr).
                super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_instance,
               this->m_surface,(VkAllocationCallbacks *)0x0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_instance_ptr).super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
              super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Surface::~Surface() {
	if (m_surface)
		vkDestroySurfaceKHR(m_instance_ptr->GetHandle(), m_surface, nullptr);
}